

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
GetId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
          (PersistentStorageJson *this,RegistrarId *aId,Network *aRet,string *aArrName)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  json *this_01;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itValue;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_f0;
  iterator local_d0;
  iterator local_b0;
  Network local_90;
  
  this_01 = &this->mCache;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_b0,pvVar2);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_d0,pvVar2);
  std::
  find_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,ot::commissioner::persistent_storage::PersistentStorageJson::GetId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>(ot::commissioner::persistent_storage::NetworkId_const&,ot::commissioner::persistent_storage::Network&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::Network_const&)_1_>
            (&local_f0,&local_b0,&local_d0,(anon_class_8_1_ba1d30bc_for__M_pred)aId);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&local_90,pvVar2);
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_f0,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_90);
  if (!bVar1) {
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<ot::commissioner::persistent_storage::Network,_ot::commissioner::persistent_storage::Network,_0>
              (&local_90,this_00);
    Network::operator=(aRet,&local_90);
    Network::~Network(&local_90);
  }
  return bVar1;
}

Assistant:

Status GetId(I const &aId, V &aRet, std::string aArrName)
    {
        auto itValue = std::find_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aId](V const &el) { return el.mId.mId == aId.mId; });
        if (itValue == std::end(mCache[aArrName]))
        {
            return Status::kNotFound;
        }

        aRet = *itValue;

        return Status::kSuccess;
    }